

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

UInt32 testing::internal::CreateCodePointFromUtf16SurrogatePair(wchar_t first,wchar_t second)

{
  UInt32 mask;
  wchar_t second_local;
  wchar_t first_local;
  
  return first;
}

Assistant:

inline UInt32 CreateCodePointFromUtf16SurrogatePair(wchar_t first,
                                                    wchar_t second) {
  const UInt32 mask = (1 << 10) - 1;
  return (sizeof(wchar_t) == 2) ?
      (((first & mask) << 10) | (second & mask)) + 0x10000 :
      // This function should not be called when the condition is
      // false, but we provide a sensible default in case it is.
      static_cast<UInt32>(first);
}